

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int ixxx::posix::mkstemp(char *__template)

{
  int iVar1;
  mkstemp_error *this;
  int *piVar2;
  int r;
  char *tmplate_local;
  
  iVar1 = ::mkstemp(__template);
  if (iVar1 == -1) {
    this = (mkstemp_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    mkstemp_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&mkstemp_error::typeinfo,mkstemp_error::~mkstemp_error);
  }
  return iVar1;
}

Assistant:

int mkstemp(char *tmplate)
    {
      int r = ::mkstemp(tmplate);
      if (r == -1)
        throw mkstemp_error(errno);
      return r;
    }